

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O3

void __thiscall pktalloc::Allocator::~Allocator(Allocator *this)

{
  uint uVar1;
  WindowHeader *pWVar2;
  uint8_t *puVar3;
  uint uVar4;
  
  uVar1 = (this->PreferredWindows).Size;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pWVar2 = (this->PreferredWindows).DataPtr[(int)uVar4];
      if (((pWVar2 != (WindowHeader *)0x0) && (pWVar2->Preallocated == false)) &&
         ((ulong)(byte)pWVar2[-1].field_0x10f < 0x20)) {
        free((void *)(((ulong)(byte)pWVar2[-1].field_0x10f - 0x20) + (long)pWVar2));
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uVar1 = (this->FullWindows).Size;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pWVar2 = (this->FullWindows).DataPtr[(int)uVar4];
      if (((pWVar2 != (WindowHeader *)0x0) && (pWVar2->Preallocated == false)) &&
         ((ulong)(byte)pWVar2[-1].field_0x10f < 0x20)) {
        free((void *)(((ulong)(byte)pWVar2[-1].field_0x10f - 0x20) + (long)pWVar2));
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  puVar3 = this->HugeChunkStart;
  if ((puVar3 != (uint8_t *)0x0) && ((ulong)puVar3[-1] < 0x20)) {
    free(puVar3 + ((ulong)puVar3[-1] - 0x20));
    return;
  }
  return;
}

Assistant:

Allocator::~Allocator()
{
    for (unsigned i = 0, count = PreferredWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = PreferredWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    for (unsigned i = 0, count = FullWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = FullWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    SIMDSafeFree(HugeChunkStart);
}